

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txout_txoutreference.cpp
# Opt level: O3

void __thiscall TxOut_Constractor_Test::~TxOut_Constractor_Test(TxOut_Constractor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TxOut, Constractor) {
  {
    int64_t satoshi = 0;
    TxOut txout;
    EXPECT_EQ(txout.GetValue().GetSatoshiValue(), satoshi);
    EXPECT_EQ(txout.GetLockingScript().IsEmpty(), true);
  }

  {
    int64_t satoshi = 1000000;
    TxOut txout(Amount::CreateBySatoshiAmount(satoshi), exp_script);
    EXPECT_EQ(txout.GetValue().GetSatoshiValue(), satoshi);
    EXPECT_EQ(txout.GetLockingScript().IsEmpty(), false);
    EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(),
                 exp_script.GetHex().c_str());
  }

  {
    int64_t satoshi = 1000000;
    Address address("mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc");
    TxOut txout;
    EXPECT_NO_THROW((txout = TxOut(Amount::CreateBySatoshiAmount(satoshi), address)));
    EXPECT_EQ(txout.GetValue().GetSatoshiValue(), satoshi);
    EXPECT_EQ(txout.GetLockingScript().IsEmpty(), false);
    EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), address.GetLockingScript().GetHex().c_str());
  }
}